

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::InstanceArrayIntersectorK<4>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar5;
  uint uVar6;
  AccelData *pAVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  long lVar14;
  undefined1 auVar15 [16];
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar16;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  NodeRef nodeRef;
  ulong uVar24;
  Primitive_conflict4 *prim;
  Intersectors *pIVar25;
  ulong uVar26;
  byte bVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  Intersectors *pIVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai_2;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_ZMM0 [64];
  vint4 bi;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  vint4 bi_1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  vint4 ai;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 uVar75;
  vint4 bi_3;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 bi_5;
  undefined1 auVar79 [16];
  vint4 ai_4;
  undefined1 auVar80 [64];
  vint4 bi_4;
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  int in_XMM14_Da;
  int in_XMM14_Db;
  int in_XMM14_Dc;
  int in_XMM14_Dd;
  undefined1 auVar89 [64];
  int in_XMM15_Da;
  int in_XMM15_Db;
  int in_XMM15_Dc;
  int in_XMM15_Dd;
  undefined1 auVar90 [64];
  int in_XMM16_Da;
  int in_XMM16_Db;
  int in_XMM16_Dc;
  int in_XMM16_Dd;
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  vbool<4>_conflict valid0;
  InstanceArrayIntersectorK<4> local_118a;
  Precalculations pre;
  Intersectors *local_1180;
  uint local_1138 [4];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar40 [16];
  
  auVar40 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  uVar32 = vpcmpeqd_avx512vl(auVar40,(undefined1  [16])valid_i->field_0);
  uVar32 = uVar32 & 0xf;
  bVar18 = (byte)uVar32;
  if (bVar18 == 0) {
    return;
  }
  pAVar7 = This->ptr;
  local_10e8 = *(undefined1 (*) [16])ray;
  auVar82 = ZEXT1664(local_10e8);
  local_10f8 = *(undefined1 (*) [16])(ray + 0x10);
  auVar83 = ZEXT1664(local_10f8);
  local_1108 = *(undefined1 (*) [16])(ray + 0x20);
  auVar84 = ZEXT1664(local_1108);
  auVar39 = *(undefined1 (*) [16])(ray + 0x40);
  auVar72._8_4_ = 0x7fffffff;
  auVar72._0_8_ = 0x7fffffff7fffffff;
  auVar72._12_4_ = 0x7fffffff;
  auVar76._8_4_ = 0x219392ef;
  auVar76._0_8_ = 0x219392ef219392ef;
  auVar76._12_4_ = 0x219392ef;
  auVar34 = vandps_avx(auVar39,auVar72);
  uVar22 = vcmpps_avx512vl(auVar34,auVar76,1);
  auVar34 = vblendmps_avx512vl(auVar39,auVar76);
  bVar30 = (bool)((byte)uVar22 & 1);
  auVar38._0_4_ = (uint)bVar30 * auVar34._0_4_ | (uint)!bVar30 * in_XMM14_Da;
  bVar30 = (bool)((byte)(uVar22 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar30 * auVar34._4_4_ | (uint)!bVar30 * in_XMM14_Db;
  bVar30 = (bool)((byte)(uVar22 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar30 * auVar34._8_4_ | (uint)!bVar30 * in_XMM14_Dc;
  bVar30 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar30 * auVar34._12_4_ | (uint)!bVar30 * in_XMM14_Dd;
  auVar34 = *(undefined1 (*) [16])(ray + 0x50);
  auVar35 = vandps_avx(auVar34,auVar72);
  uVar22 = vcmpps_avx512vl(auVar35,auVar76,1);
  auVar35 = vblendmps_avx512vl(auVar34,auVar76);
  bVar30 = (bool)((byte)uVar22 & 1);
  auVar56._0_4_ = (uint)bVar30 * auVar35._0_4_ | (uint)!bVar30 * in_XMM15_Da;
  bVar30 = (bool)((byte)(uVar22 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar30 * auVar35._4_4_ | (uint)!bVar30 * in_XMM15_Db;
  bVar30 = (bool)((byte)(uVar22 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar30 * auVar35._8_4_ | (uint)!bVar30 * in_XMM15_Dc;
  bVar30 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar30 * auVar35._12_4_ | (uint)!bVar30 * in_XMM15_Dd;
  auVar35 = *(undefined1 (*) [16])(ray + 0x60);
  auVar80 = ZEXT1664(auVar35);
  auVar36 = vandps_avx(auVar35,auVar72);
  uVar22 = vcmpps_avx512vl(auVar36,auVar76,1);
  auVar36 = vblendmps_avx512vl(auVar35,auVar76);
  bVar30 = (bool)((byte)uVar22 & 1);
  auVar58._0_4_ = (uint)bVar30 * auVar36._0_4_ | (uint)!bVar30 * in_XMM16_Da;
  bVar30 = (bool)((byte)(uVar22 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar30 * auVar36._4_4_ | (uint)!bVar30 * in_XMM16_Db;
  bVar30 = (bool)((byte)(uVar22 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar30 * auVar36._8_4_ | (uint)!bVar30 * in_XMM16_Dc;
  bVar30 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar30 * auVar36._12_4_ | (uint)!bVar30 * in_XMM16_Dd;
  auVar37 = vrcp14ps_avx512vl(auVar38);
  auVar60 = ZEXT816(0) << 0x40;
  auVar85 = ZEXT1664(auVar60);
  auVar77._8_4_ = 0x3f800000;
  auVar77._0_8_ = 0x3f8000003f800000;
  auVar77._12_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar38,auVar37,auVar77);
  local_1088 = vfmadd132ps_fma(auVar36,auVar37,auVar37);
  auVar89 = ZEXT1664(local_1088);
  auVar38 = vrcp14ps_avx512vl(auVar56);
  auVar36 = vfnmadd213ps_fma(auVar56,auVar38,auVar77);
  local_1098 = vfmadd132ps_fma(auVar36,auVar38,auVar38);
  auVar90 = ZEXT1664(local_1098);
  auVar36 = vrcp14ps_avx512vl(auVar58);
  auVar38 = vfnmadd213ps_avx512vl(auVar58,auVar36,auVar77);
  local_10a8 = vfmadd132ps_avx512vl(auVar38,auVar36,auVar36);
  auVar91 = ZEXT1664(local_10a8);
  local_1118 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar60);
  local_1128 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar60);
  uVar19 = (ulong)(bVar18 ^ 0xf);
  auVar39 = vcmpps_avx(auVar39,auVar60,1);
  auVar36._8_4_ = 1;
  auVar36._0_8_ = 0x100000001;
  auVar36._12_4_ = 1;
  auVar36 = vandps_avx512vl(auVar39,auVar36);
  auVar73._8_4_ = 2;
  auVar73._0_8_ = 0x200000002;
  auVar73._12_4_ = 2;
  uVar22 = vcmpps_avx512vl(auVar34,auVar60,1);
  auVar39 = vpsubd_avx512vl(auVar73,auVar39);
  bVar30 = (bool)((byte)uVar22 & 1);
  auVar34._0_4_ = (uint)bVar30 * auVar39._0_4_ | (uint)!bVar30 * auVar36._0_4_;
  bVar30 = (bool)((byte)(uVar22 >> 1) & 1);
  auVar34._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * auVar36._4_4_;
  bVar30 = (bool)((byte)(uVar22 >> 2) & 1);
  auVar34._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * auVar36._8_4_;
  bVar30 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar34._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * auVar36._12_4_;
  uVar22 = vcmpps_avx512vl(auVar35,auVar60,1);
  auVar39._8_4_ = 4;
  auVar39._0_8_ = 0x400000004;
  auVar39._12_4_ = 4;
  auVar39 = vpord_avx512vl(auVar34,auVar39);
  bVar30 = (bool)((byte)uVar22 & 1);
  auVar35._0_4_ = (uint)bVar30 * auVar39._0_4_ | !bVar30 * auVar34._0_4_;
  bVar30 = (bool)((byte)(uVar22 >> 1) & 1);
  auVar35._4_4_ = (uint)bVar30 * auVar39._4_4_ | !bVar30 * auVar34._4_4_;
  bVar30 = (bool)((byte)(uVar22 >> 2) & 1);
  auVar35._8_4_ = (uint)bVar30 * auVar39._8_4_ | !bVar30 * auVar34._8_4_;
  bVar30 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar35._12_4_ = (uint)bVar30 * auVar39._12_4_ | !bVar30 * auVar34._12_4_;
  auVar71 = ZEXT1664(auVar35);
  auVar39 = vmovdqa32_avx512vl(auVar35);
  bVar30 = (bool)((byte)(uVar32 >> 1) & 1);
  bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
  bVar11 = SUB81(uVar32 >> 3,0);
  local_1138[0] = (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar40._0_4_;
  local_1138[1] = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * auVar40._4_4_;
  local_1138[2] = (uint)bVar8 * auVar39._8_4_ | (uint)!bVar8 * auVar40._8_4_;
  local_1138[3] = (uint)bVar11 * auVar39._12_4_ | (uint)!bVar11 * auVar40._12_4_;
  auVar68 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
  auVar40._0_8_ = local_10e8._0_8_ ^ 0x8000000080000000;
  auVar40._8_4_ = local_10e8._8_4_ ^ 0x80000000;
  auVar40._12_4_ = local_10e8._12_4_ ^ 0x80000000;
  local_10b8 = vmulps_avx512vl(local_1088,auVar40);
  auVar92 = ZEXT1664(local_10b8);
  auVar37._0_8_ = local_10f8._0_8_ ^ 0x8000000080000000;
  auVar37._8_4_ = local_10f8._8_4_ ^ 0x80000000;
  auVar37._12_4_ = local_10f8._12_4_ ^ 0x80000000;
  local_10c8 = vmulps_avx512vl(local_1098,auVar37);
  auVar94 = ZEXT1664(local_10c8);
  auVar60._0_8_ = local_1108._0_8_ ^ 0x8000000080000000;
  auVar60._8_4_ = local_1108._8_4_ ^ 0x80000000;
  auVar60._12_4_ = local_1108._12_4_ ^ 0x80000000;
  local_10d8 = vmulps_avx512vl(local_10a8,auVar60);
  auVar95 = ZEXT1664(local_10d8);
LAB_006f3e02:
  lVar14 = 0;
  for (uVar22 = uVar32; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar14 = lVar14 + 1;
  }
  uVar6 = local_1138[lVar14];
  auVar61._4_4_ = uVar6;
  auVar61._0_4_ = uVar6;
  auVar61._8_4_ = uVar6;
  auVar61._12_4_ = uVar6;
  auVar15._4_4_ = local_1138[1];
  auVar15._0_4_ = local_1138[0];
  auVar15._8_4_ = local_1138[2];
  auVar15._12_4_ = local_1138[3];
  uVar33 = vpcmpeqd_avx512vl(auVar61,auVar15);
  uVar33 = uVar33 & 0xf;
  bVar27 = (byte)uVar33;
  This = (Intersectors *)CONCAT44((int)((ulong)This >> 0x20),(uint)bVar27);
  auVar86._8_4_ = 0x7f800000;
  auVar86._0_8_ = 0x7f8000007f800000;
  auVar86._12_4_ = 0x7f800000;
  auVar40 = vblendmps_avx512vl(auVar86,local_10e8);
  auVar41._0_4_ = (uint)(bVar27 & 1) * auVar40._0_4_ | !(bool)(bVar27 & 1) * uVar6;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar30 * auVar40._4_4_ | !bVar30 * uVar6;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar30 * auVar40._8_4_ | !bVar30 * uVar6;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar41._12_4_ = (uint)bVar30 * auVar40._12_4_ | !bVar30 * uVar6;
  auVar40 = vblendmps_avx512vl(auVar86,local_10f8);
  auVar42._0_4_ = (uint)(bVar27 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar68._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar30 * auVar40._4_4_ | (uint)!bVar30 * auVar68._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar30 * auVar40._8_4_ | (uint)!bVar30 * auVar68._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar42._12_4_ = (uint)bVar30 * auVar40._12_4_ | (uint)!bVar30 * auVar68._12_4_;
  auVar40 = vblendmps_avx512vl(auVar86,local_1108);
  auVar43._0_4_ = (uint)(bVar27 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar71._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar30 * auVar40._4_4_ | (uint)!bVar30 * auVar71._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar30 * auVar40._8_4_ | (uint)!bVar30 * auVar71._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar43._12_4_ = (uint)bVar30 * auVar40._12_4_ | (uint)!bVar30 * auVar71._12_4_;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar39 = vblendmps_avx512vl(auVar40,local_10e8);
  auVar44._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * local_10e8._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * local_10e8._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * local_10e8._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar44._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * local_10e8._12_4_;
  auVar39 = vblendmps_avx512vl(auVar40,local_10f8);
  auVar45._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * local_10f8._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * local_10f8._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * local_10f8._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar45._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * local_10f8._12_4_;
  auVar39 = vblendmps_avx512vl(auVar40,local_1108);
  auVar46._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * local_1108._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * local_1108._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * local_1108._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar46._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * local_1108._12_4_;
  auVar39 = vblendmps_avx512vl(auVar86,auVar89._0_16_);
  auVar47._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar80._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * auVar80._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * auVar80._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar47._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * auVar80._12_4_;
  auVar39 = vblendmps_avx512vl(auVar86,auVar90._0_16_);
  auVar48._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar82._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar48._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * auVar82._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar48._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * auVar82._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar48._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * auVar82._12_4_;
  auVar39 = vblendmps_avx512vl(auVar86,auVar91._0_16_);
  auVar49._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar83._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar49._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * auVar83._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar49._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * auVar83._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar49._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * auVar83._12_4_;
  auVar39 = vblendmps_avx512vl(auVar40,auVar89._0_16_);
  auVar50._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar84._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar50._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * auVar84._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar50._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * auVar84._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar50._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * auVar84._12_4_;
  auVar39 = vblendmps_avx512vl(auVar40,auVar90._0_16_);
  auVar51._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar85._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar51._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * auVar85._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar51._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * auVar85._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar51._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * auVar85._12_4_;
  auVar39 = vblendmps_avx512vl(auVar40,auVar91._0_16_);
  auVar52._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * in_ZMM11._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar52._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * in_ZMM11._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar52._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * in_ZMM11._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar52._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * in_ZMM11._12_4_;
  auVar39 = vblendmps_avx512vl(auVar86,local_1118);
  auVar53._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * 0x7f800000;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar53._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * 0x7f800000;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar53._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * 0x7f800000;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar53._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * 0x7f800000;
  auVar40 = vblendmps_avx512vl(auVar40,local_1128);
  auVar54._0_4_ = (uint)(bVar27 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar27 & 1) * in_ZMM21._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar54._4_4_ = (uint)bVar30 * auVar40._4_4_ | (uint)!bVar30 * in_ZMM21._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar54._8_4_ = (uint)bVar30 * auVar40._8_4_ | (uint)!bVar30 * in_ZMM21._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar54._12_4_ = (uint)bVar30 * auVar40._12_4_ | (uint)!bVar30 * in_ZMM21._12_4_;
  in_ZMM21 = ZEXT1664(auVar54);
  auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x7f800000));
  auVar39 = vpblendmd_avx512vl(auVar40,local_1118);
  auVar55._0_4_ = (uint)(bVar27 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar40._0_4_;
  bVar30 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar55._4_4_ = (uint)bVar30 * auVar39._4_4_ | (uint)!bVar30 * auVar40._4_4_;
  bVar30 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar55._8_4_ = (uint)bVar30 * auVar39._8_4_ | (uint)!bVar30 * auVar40._8_4_;
  bVar30 = SUB81(uVar33 >> 3,0);
  auVar55._12_4_ = (uint)bVar30 * auVar39._12_4_ | (uint)!bVar30 * auVar40._12_4_;
  auVar93 = ZEXT1664(auVar55);
  uVar32 = ~(ulong)This & uVar32;
  auVar40 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar39 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vminps_avx(auVar39,auVar40);
  auVar39 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar39 = vminps_avx(auVar39,auVar42);
  auVar34 = vshufpd_avx(auVar39,auVar39,1);
  auVar39 = vminps_avx(auVar34,auVar39);
  auVar40 = vinsertps_avx(auVar40,auVar39,0x1c);
  auVar39 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar39 = vminps_avx(auVar39,auVar43);
  auVar34 = vshufpd_avx(auVar39,auVar39,1);
  auVar39 = vminps_avx(auVar34,auVar39);
  auVar40 = vinsertps_avx(auVar40,auVar39,0x20);
  auVar39 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar39 = vmaxps_avx(auVar39,auVar44);
  auVar34 = vshufpd_avx(auVar39,auVar39,1);
  auVar39 = vmaxps_avx(auVar34,auVar39);
  auVar34 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar34 = vmaxps_avx(auVar34,auVar45);
  auVar35 = vshufpd_avx(auVar34,auVar34,1);
  auVar34 = vmaxps_avx(auVar35,auVar34);
  auVar39 = vinsertps_avx(auVar39,auVar34,0x1c);
  auVar34 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar34 = vmaxps_avx(auVar34,auVar46);
  auVar35 = vshufpd_avx(auVar34,auVar34,1);
  auVar34 = vmaxps_avx(auVar35,auVar34);
  auVar39 = vinsertps_avx(auVar39,auVar34,0x20);
  auVar34 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar34 = vminps_avx(auVar34,auVar47);
  auVar35 = vshufpd_avx(auVar34,auVar34,1);
  auVar34 = vminps_avx(auVar35,auVar34);
  auVar35 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar35 = vminps_avx(auVar35,auVar48);
  auVar36 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vminps_avx(auVar36,auVar35);
  auVar34 = vinsertps_avx(auVar34,auVar35,0x1c);
  auVar35 = vshufps_avx(auVar49,auVar49,0xb1);
  auVar35 = vminps_avx(auVar35,auVar49);
  auVar36 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vminps_avx(auVar36,auVar35);
  auVar34 = vinsertps_avx(auVar34,auVar35,0x20);
  auVar35 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar35 = vmaxps_avx(auVar35,auVar50);
  auVar36 = vshufpd_avx(auVar35,auVar35,1);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vshufps_avx(auVar51,auVar51,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar51);
  auVar38 = vshufpd_avx(auVar36,auVar36,1);
  auVar36 = vmaxps_avx(auVar38,auVar36);
  auVar35 = vinsertps_avx(auVar35,auVar36,0x1c);
  auVar36 = vshufps_avx(auVar52,auVar52,0xb1);
  auVar36 = vmaxps_avx(auVar36,auVar52);
  auVar38 = vshufpd_avx(auVar36,auVar36,1);
  auVar36 = vmaxps_avx(auVar38,auVar36);
  auVar35 = vinsertps_avx(auVar35,auVar36,0x20);
  auVar36 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar36 = vminps_avx(auVar36,auVar53);
  auVar38 = vshufps_avx512vl(auVar54,auVar54,0xb1);
  auVar56 = vmaxps_avx512vl(auVar38,auVar54);
  uVar22 = vcmpps_avx512vl(auVar34,ZEXT416(0) << 0x20,5);
  auVar38 = vblendmps_avx512vl(auVar35,auVar34);
  bVar27 = (byte)uVar22;
  fVar1 = (float)((uint)(bVar27 & 1) * auVar38._0_4_);
  fVar2 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar38._4_4_);
  auVar57._4_4_ = fVar2;
  auVar57._0_4_ = fVar1;
  fVar3 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar38._8_4_);
  auVar57._8_4_ = fVar3;
  fVar4 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar38._12_4_);
  auVar57._12_4_ = fVar4;
  auVar80 = ZEXT1664(auVar57);
  auVar58 = vblendmps_avx512vl(auVar40,auVar39);
  bVar30 = (bool)((byte)(uVar22 >> 1) & 1);
  bVar9 = (bool)((byte)(uVar22 >> 2) & 1);
  bVar12 = (bool)((byte)(uVar22 >> 3) & 1);
  bVar8 = (bool)((byte)(uVar22 >> 1) & 1);
  bVar10 = (bool)((byte)(uVar22 >> 2) & 1);
  bVar13 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar38 = vmovshdup_avx(auVar57);
  uVar23 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x20;
  auVar38 = vshufpd_avx(auVar57,auVar57,1);
  uVar29 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x40;
  auVar59._0_4_ =
       (float)((uint)(bVar27 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar34._0_4_);
  bVar11 = (bool)((byte)(uVar22 >> 1) & 1);
  auVar59._4_4_ = (float)((uint)bVar11 * auVar35._4_4_ | (uint)!bVar11 * auVar34._4_4_);
  bVar11 = (bool)((byte)(uVar22 >> 2) & 1);
  auVar59._8_4_ = (float)((uint)bVar11 * auVar35._8_4_ | (uint)!bVar11 * auVar34._8_4_);
  bVar11 = (bool)((byte)(uVar22 >> 3) & 1);
  auVar59._12_4_ = (float)((uint)bVar11 * auVar35._12_4_ | (uint)!bVar11 * auVar34._12_4_);
  auVar63._0_4_ =
       (float)((uint)(bVar27 & 1) * auVar58._0_4_ | !(bool)(bVar27 & 1) * auVar48._0_4_) * fVar1;
  auVar63._4_4_ = (float)((uint)bVar30 * auVar58._4_4_ | !bVar30 * auVar48._4_4_) * fVar2;
  auVar63._8_4_ = (float)((uint)bVar9 * auVar58._8_4_ | !bVar9 * auVar48._8_4_) * fVar3;
  auVar63._12_4_ = (float)((uint)bVar12 * auVar58._12_4_ | !bVar12 * auVar48._12_4_) * fVar4;
  auVar69._0_4_ =
       (float)((uint)(bVar27 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar27 & 1) * auVar39._0_4_) *
       auVar59._0_4_;
  auVar69._4_4_ =
       (float)((uint)bVar8 * auVar40._4_4_ | (uint)!bVar8 * auVar39._4_4_) * auVar59._4_4_;
  auVar69._8_4_ =
       (float)((uint)bVar10 * auVar40._8_4_ | (uint)!bVar10 * auVar39._8_4_) * auVar59._8_4_;
  auVar69._12_4_ =
       (float)((uint)bVar13 * auVar40._12_4_ | (uint)!bVar13 * auVar39._12_4_) * auVar59._12_4_;
  auVar71 = ZEXT1664(auVar69);
  uVar28 = (ulong)(fVar1 < 0.0) * 0x10;
  stack[0].ptr.ptr = *(size_t *)&pAVar7[1].bounds.bounds0.lower.field_0;
  stack[0].mask = (size_t)This;
  local_fa8._4_4_ = fVar1;
  local_fa8._0_4_ = fVar1;
  local_fa8._8_4_ = fVar1;
  local_fa8._12_4_ = fVar1;
  auVar83 = ZEXT1664(local_fa8);
  auVar81._8_4_ = 0x80000000;
  auVar81._0_8_ = 0x8000000080000000;
  auVar81._12_4_ = 0x80000000;
  auVar82 = ZEXT1664(auVar81);
  uVar22 = CONCAT44(auVar63._0_4_,auVar63._0_4_);
  local_fb8._0_8_ = uVar22 ^ 0x8000000080000000;
  local_fb8._8_4_ = -auVar63._0_4_;
  local_fb8._12_4_ = -auVar63._0_4_;
  auVar84 = ZEXT1664(local_fb8);
  local_fc8 = vshufps_avx(auVar57,auVar57,0x55);
  auVar85 = ZEXT1664(local_fc8);
  auVar40 = vshufps_avx(auVar63,auVar63,0x55);
  local_fd8._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
  local_fd8._8_4_ = auVar40._8_4_ ^ 0x80000000;
  local_fd8._12_4_ = auVar40._12_4_ ^ 0x80000000;
  in_ZMM11 = ZEXT1664(local_fd8);
  local_fe8 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar87 = ZEXT1664(local_fe8);
  auVar40 = vshufps_avx(auVar63,auVar63,0xaa);
  local_ff8._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
  local_ff8._8_4_ = auVar40._8_4_ ^ 0x80000000;
  local_ff8._12_4_ = auVar40._12_4_ ^ 0x80000000;
  auVar88 = ZEXT1664(local_ff8);
  local_1008 = vbroadcastss_avx512vl(auVar59);
  auVar96 = ZEXT1664(local_1008);
  auVar64._4_4_ = auVar69._0_4_;
  auVar64._0_4_ = auVar69._0_4_;
  auVar64._8_4_ = auVar69._0_4_;
  auVar64._12_4_ = auVar69._0_4_;
  local_1018 = vxorps_avx512vl(auVar64,auVar81);
  auVar97 = ZEXT1664(local_1018);
  local_1028 = vshufps_avx512vl(auVar59,auVar59,0x55);
  auVar98 = ZEXT1664(local_1028);
  uVar75 = auVar36._0_4_;
  auVar65._4_4_ = uVar75;
  auVar65._0_4_ = uVar75;
  auVar65._8_4_ = uVar75;
  auVar65._12_4_ = uVar75;
  auVar40 = vshufps_avx(auVar36,auVar36,0xaa);
  local_1038 = vminps_avx512vl(auVar40,auVar65);
  auVar99 = ZEXT1664(local_1038);
  uVar75 = auVar56._0_4_;
  auVar66._4_4_ = uVar75;
  auVar66._0_4_ = uVar75;
  auVar66._8_4_ = uVar75;
  auVar66._12_4_ = uVar75;
  auVar40 = vshufps_avx(auVar56,auVar56,0xaa);
  local_1048 = vmaxps_avx512vl(auVar40,auVar66);
  auVar100 = ZEXT1664(local_1048);
  auVar40 = vshufps_avx(auVar69,auVar69,0x55);
  auVar68 = ZEXT1664(auVar40);
  local_1058 = vxorps_avx512vl(auVar40,auVar81);
  auVar101 = ZEXT1664(local_1058);
  local_1068 = vshufps_avx512vl(auVar59,auVar59,0xaa);
  auVar102 = ZEXT1664(local_1068);
  auVar40 = vshufps_avx(auVar69,auVar69,0xaa);
  local_1078 = vxorps_avx512vl(auVar40,auVar81);
  auVar103 = ZEXT1664(local_1078);
  pSVar20 = stack + 1;
  local_f98 = vmovdqa64_avx512vl(auVar55);
LAB_006f419d:
  bVar27 = (byte)uVar19;
  while (pSVar5 = pSVar20 + -1, pSVar16 = pSVar20 + -1, pSVar20 = pSVar5,
        (pSVar16->mask & ~uVar19) != 0) {
    uVar22 = (pSVar5->ptr).ptr;
    local_f88 = in_ZMM21._0_16_;
    uVar24 = uVar22;
    if ((uVar22 & 8) != 0) {
LAB_006f4356:
      valid0.v = bVar27 ^ 0xf;
      pIVar25 = (Intersectors *)((ulong)((uint)uVar22 & 0xf) - 8);
      This = pIVar25;
      bVar17 = bVar27;
      if (pIVar25 == (Intersectors *)0x0) goto LAB_006f44a9;
      prim = (Primitive_conflict4 *)(uVar22 & 0xfffffffffffffff0);
      local_1180 = (Intersectors *)0x1;
      goto LAB_006f4392;
    }
    while( true ) {
      auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar28),auVar84._0_16_,
                                auVar83._0_16_);
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar23),in_ZMM11._0_16_,
                                auVar85._0_16_);
      auVar40 = vpmaxsd_avx(auVar40,auVar39);
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar29),auVar88._0_16_,
                                auVar87._0_16_);
      auVar39 = vpmaxsd_avx512vl(auVar39,auVar99._0_16_);
      auVar40 = vpmaxsd_avx(auVar40,auVar39);
      auVar39 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar28 ^ 0x10)),auVar97._0_16_,
                           auVar96._0_16_);
      auVar34 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar23 ^ 0x10)),auVar101._0_16_,
                           auVar98._0_16_);
      auVar39 = vpminsd_avx(auVar39,auVar34);
      auVar34 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar29 ^ 0x10)),auVar103._0_16_,
                           auVar102._0_16_);
      auVar34 = vpminsd_avx512vl(auVar34,auVar100._0_16_);
      auVar71 = ZEXT1664(auVar34);
      auVar39 = vpminsd_avx(auVar39,auVar34);
      auVar68 = ZEXT1664(auVar39);
      uVar26 = vcmpps_avx512vl(auVar40,auVar39,2);
      if ((char)uVar26 == '\0') break;
      uVar21 = 8;
      pIVar25 = (Intersectors *)0x0;
      do {
        lVar14 = 0;
        for (uVar22 = uVar26; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          lVar14 = lVar14 + 1;
        }
        uVar75 = *(undefined4 *)(uVar24 + 0x20 + lVar14 * 4);
        auVar62._4_4_ = uVar75;
        auVar62._0_4_ = uVar75;
        auVar62._8_4_ = uVar75;
        auVar62._12_4_ = uVar75;
        auVar34 = vfmadd132ps_avx512vl(auVar62,auVar92._0_16_,auVar89._0_16_);
        uVar75 = *(undefined4 *)(uVar24 + 0x40 + lVar14 * 4);
        auVar67._4_4_ = uVar75;
        auVar67._0_4_ = uVar75;
        auVar67._8_4_ = uVar75;
        auVar67._12_4_ = uVar75;
        auVar35 = vfmadd132ps_avx512vl(auVar67,auVar94._0_16_,auVar90._0_16_);
        uVar75 = *(undefined4 *)(uVar24 + 0x60 + lVar14 * 4);
        auVar70._4_4_ = uVar75;
        auVar70._0_4_ = uVar75;
        auVar70._8_4_ = uVar75;
        auVar70._12_4_ = uVar75;
        auVar36 = vfmadd132ps_avx512vl(auVar70,auVar95._0_16_,auVar91._0_16_);
        auVar71 = ZEXT1664(auVar36);
        uVar75 = *(undefined4 *)(uVar24 + 0x30 + lVar14 * 4);
        auVar74._4_4_ = uVar75;
        auVar74._0_4_ = uVar75;
        auVar74._8_4_ = uVar75;
        auVar74._12_4_ = uVar75;
        auVar38 = vfmadd132ps_avx512vl(auVar74,auVar92._0_16_,auVar89._0_16_);
        uVar75 = *(undefined4 *)(uVar24 + 0x50 + lVar14 * 4);
        auVar78._4_4_ = uVar75;
        auVar78._0_4_ = uVar75;
        auVar78._8_4_ = uVar75;
        auVar78._12_4_ = uVar75;
        auVar56 = vfmadd132ps_avx512vl(auVar78,auVar94._0_16_,auVar90._0_16_);
        uVar75 = *(undefined4 *)(uVar24 + 0x70 + lVar14 * 4);
        auVar79._4_4_ = uVar75;
        auVar79._0_4_ = uVar75;
        auVar79._8_4_ = uVar75;
        auVar79._12_4_ = uVar75;
        auVar58 = vfmadd132ps_avx512vl(auVar79,auVar95._0_16_,auVar91._0_16_);
        auVar40 = vpminsd_avx(auVar34,auVar38);
        auVar39 = vpminsd_avx(auVar35,auVar56);
        auVar40 = vpmaxsd_avx(auVar40,auVar39);
        auVar39 = vpminsd_avx(auVar36,auVar58);
        auVar39 = vpmaxsd_avx512vl(auVar39,auVar93._0_16_);
        auVar82 = ZEXT1664(auVar39);
        auVar40 = vpmaxsd_avx(auVar40,auVar39);
        auVar80 = ZEXT1664(auVar40);
        auVar39 = vpmaxsd_avx(auVar34,auVar38);
        auVar34 = vpmaxsd_avx(auVar35,auVar56);
        auVar34 = vpminsd_avx(auVar39,auVar34);
        auVar39 = vpmaxsd_avx(auVar36,auVar58);
        auVar39 = vpminsd_avx512vl(auVar39,local_f88);
        auVar68 = ZEXT1664(auVar39);
        auVar39 = vpminsd_avx(auVar34,auVar39);
        uVar22 = vpcmpd_avx512vl(auVar40,auVar39,2);
        pIVar31 = (Intersectors *)(uVar22 & 0xf);
        uVar22 = uVar21;
        This = pIVar25;
        if (((char)pIVar31 != '\0') &&
           (uVar22 = *(ulong *)(uVar24 + lVar14 * 8), This = pIVar31, uVar21 != 8)) {
          (pSVar20->ptr).ptr = uVar21;
          pSVar20->mask = (size_t)pIVar25;
          pSVar20 = pSVar20 + 1;
        }
        uVar26 = uVar26 - 1 & uVar26;
        uVar21 = uVar22;
        pIVar25 = This;
      } while (uVar26 != 0);
      if (uVar22 == 8) break;
      uVar24 = uVar22;
      if ((uVar22 & 8) != 0) {
        if (This == (Intersectors *)0x0) goto LAB_006f44c8;
        goto LAB_006f4356;
      }
    }
    if (pSVar20 == stack) goto LAB_006f44df;
  }
  goto LAB_006f44c8;
  while( true ) {
    prim = prim + 1;
    bVar30 = pIVar25 <= local_1180;
    This = local_1180;
    local_1180 = (Intersectors *)((long)&local_1180->ptr + 1);
    if (bVar30) break;
LAB_006f4392:
    This = (Intersectors *)&valid0;
    InstanceArrayIntersectorK<4>::occluded
              (&local_118a,(vbool<4>_conflict *)This,&pre,ray,context,prim);
    valid0.v = ~(byte)local_118a & valid0.v & 0xf;
    if (valid0.v == 0) break;
  }
  bVar17 = valid0.v ^ 0xf;
  auVar89 = ZEXT1664(local_1088);
  auVar90 = ZEXT1664(local_1098);
  auVar91 = ZEXT1664(local_10a8);
  auVar92 = ZEXT1664(local_10b8);
  auVar94 = ZEXT1664(local_10c8);
  auVar95 = ZEXT1664(local_10d8);
  in_ZMM21 = ZEXT1664(local_f88);
  auVar40 = vmovdqa64_avx512vl(local_f98);
  auVar93 = ZEXT1664(auVar40);
  auVar83 = ZEXT1664(local_fa8);
  auVar84 = ZEXT1664(local_fb8);
  auVar85 = ZEXT1664(local_fc8);
  in_ZMM11 = ZEXT1664(local_fd8);
  auVar87 = ZEXT1664(local_fe8);
  auVar88 = ZEXT1664(local_ff8);
  auVar96 = ZEXT1664(local_1008);
  auVar97 = ZEXT1664(local_1018);
  auVar98 = ZEXT1664(local_1028);
  auVar99 = ZEXT1664(local_1038);
  auVar100 = ZEXT1664(local_1048);
  auVar101 = ZEXT1664(local_1058);
  auVar102 = ZEXT1664(local_1068);
  auVar103 = ZEXT1664(local_1078);
LAB_006f44a9:
  bVar17 = bVar17 | bVar27;
  uVar19 = (ulong)bVar17;
  bVar27 = (byte)uVar33 & ~bVar17;
  uVar33 = (ulong)bVar27;
  if (bVar27 == 0) goto LAB_006f44df;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar30 = (bool)(bVar17 >> 1 & 1);
  bVar8 = (bool)(bVar17 >> 2 & 1);
  in_ZMM21 = ZEXT1664(CONCAT412((uint)(bVar17 >> 3) * auVar40._12_4_ |
                                (uint)!(bool)(bVar17 >> 3) * in_ZMM21._12_4_,
                                CONCAT48((uint)bVar8 * auVar40._8_4_ | (uint)!bVar8 * in_ZMM21._8_4_
                                         ,CONCAT44((uint)bVar30 * auVar40._4_4_ |
                                                   (uint)!bVar30 * in_ZMM21._4_4_,
                                                   (uint)(bVar17 & 1) * auVar40._0_4_ |
                                                   (uint)!(bool)(bVar17 & 1) * in_ZMM21._0_4_))));
LAB_006f44c8:
  if (pSVar20 == stack) goto LAB_006f44df;
  goto LAB_006f419d;
LAB_006f44df:
  if (uVar32 == 0) {
    bVar18 = (byte)uVar19 & bVar18;
    bVar30 = (bool)(bVar18 >> 1 & 1);
    bVar8 = (bool)(bVar18 >> 2 & 1);
    *(uint *)(ray + 0x80) =
         (uint)(bVar18 & 1) * -0x800000 | (uint)!(bool)(bVar18 & 1) * *(int *)(ray + 0x80);
    *(uint *)(ray + 0x84) = (uint)bVar30 * -0x800000 | (uint)!bVar30 * *(int *)(ray + 0x84);
    *(uint *)(ray + 0x88) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x88);
    *(uint *)(ray + 0x8c) =
         (uint)(bVar18 >> 3) * -0x800000 | (uint)!(bool)(bVar18 >> 3) * *(int *)(ray + 0x8c);
    return;
  }
  goto LAB_006f3e02;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }